

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastAdderFast_int(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int Log2,int CarryIn)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int local_5c;
  undefined4 *puStack_58;
  int Carry;
  int *pPro2;
  int *pPro;
  int *pGen;
  int local_38;
  int nBits;
  int Pro;
  int Gen;
  int b;
  int i;
  int CarryIn_local;
  int Log2_local;
  int *pAdd1_local;
  int *pAdd0_local;
  Gia_Man_t *pNew_local;
  
  pGen._4_4_ = 1 << ((byte)Log2 & 0x1f);
  b = CarryIn;
  i = Log2;
  _CarryIn_local = pAdd1;
  pAdd1_local = pAdd0;
  pAdd0_local = (int *)pNew;
  pPro = (int *)calloc((long)(pGen._4_4_ + 1),4);
  pPro2 = (int *)calloc((long)(pGen._4_4_ + 1),4);
  puStack_58 = (undefined4 *)calloc((long)(pGen._4_4_ + 1),4);
  if (pGen._4_4_ == 1) {
    local_5c = b;
    Wlc_BlastFullAdder((Gia_Man_t *)pAdd0_local,*pAdd1_local,*_CarryIn_local,b,&local_5c,pAdd1_local
                      );
    if (pPro != (int *)0x0) {
      free(pPro);
      pPro = (int *)0x0;
    }
    if (pPro2 != (int *)0x0) {
      free(pPro2);
      pPro2 = (int *)0x0;
    }
    if (puStack_58 != (undefined4 *)0x0) {
      free(puStack_58);
    }
  }
  else {
    if (pGen._4_4_ < 2) {
      __assert_fail("nBits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x1bf,"void Wlc_BlastAdderFast_int(Gia_Man_t *, int *, int *, int, int)");
    }
    *pPro = b;
    *pPro2 = 0;
    *puStack_58 = 0;
    for (Pro = 1; Pro <= pGen._4_4_; Pro = Pro + 1) {
      iVar2 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pAdd1_local[Pro + -1],_CarryIn_local[Pro + -1]
                            );
      pPro[Pro] = iVar2;
      iVar2 = Gia_ManHashXor((Gia_Man_t *)pAdd0_local,pAdd1_local[Pro + -1],_CarryIn_local[Pro + -1]
                            );
      pPro2[Pro] = iVar2;
      puStack_58[Pro] = pPro2[Pro];
    }
    for (Pro = 1; piVar1 = pAdd0_local, Pro <= pGen._4_4_; Pro = Pro + 2) {
      iVar2 = pPro[Pro];
      iVar3 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro[Pro + -1]);
      nBits = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
      local_38 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro2[Pro + -1]);
      pPro2[Pro] = local_38;
      pPro[Pro] = nBits;
    }
    for (Gen = 1; Gen < i + -1; Gen = Gen + 1) {
      for (Pro = Gen * 2 + 1; piVar1 = pAdd0_local, Pro <= pGen._4_4_; Pro = Pro + 2) {
        iVar2 = pPro[Pro];
        iVar3 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro[Pro + Gen * -2]);
        nBits = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
        local_38 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro2[Pro + Gen * -2]);
        pPro2[Pro] = local_38;
        pPro[Pro] = nBits;
      }
    }
    for (Pro = pGen._4_4_ / 2 + 1; piVar1 = pAdd0_local, Pro <= pGen._4_4_; Pro = Pro + 2) {
      iVar2 = pPro[Pro];
      iVar3 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro[Pro - pGen._4_4_ / 2]);
      nBits = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
      local_38 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro2[Pro - pGen._4_4_ / 2]);
      pPro2[Pro] = local_38;
      pPro[Pro] = nBits;
    }
    for (Pro = 2; piVar1 = pAdd0_local, Pro <= pGen._4_4_; Pro = Pro + 2) {
      iVar2 = pPro[Pro];
      iVar3 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro[Pro + -1]);
      nBits = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
      local_38 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pPro2[Pro],pPro2[Pro + -1]);
      pPro2[Pro] = local_38;
      pPro[Pro] = nBits;
    }
    for (Pro = 0; Pro < pGen._4_4_; Pro = Pro + 1) {
      iVar2 = Gia_ManHashXor((Gia_Man_t *)pAdd0_local,puStack_58[Pro + 1],pPro[Pro]);
      pAdd1_local[Pro] = iVar2;
    }
    pAdd1_local[pGen._4_4_] = pPro[pGen._4_4_];
    if (pPro != (int *)0x0) {
      free(pPro);
      pPro = (int *)0x0;
    }
    if (pPro2 != (int *)0x0) {
      free(pPro2);
      pPro2 = (int *)0x0;
    }
    if (puStack_58 != (undefined4 *)0x0) {
      free(puStack_58);
    }
  }
  return;
}

Assistant:

void Wlc_BlastAdderFast_int( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int Log2, int CarryIn ) // result is in pAdd0
{
    int i, b, Gen, Pro, nBits = 1 << Log2;
    int * pGen = ABC_CALLOC( int, nBits+1 );
    int * pPro = ABC_CALLOC( int, nBits+1 );
    int * pPro2= ABC_CALLOC( int, nBits+1 );
    if ( nBits == 1 )
    {
        int Carry = CarryIn;
        Wlc_BlastFullAdder( pNew, pAdd0[0], pAdd1[0], Carry, &Carry, &pAdd0[0] );
        ABC_FREE(pGen);
        ABC_FREE(pPro);
        ABC_FREE(pPro2);
        return;
    }
    assert( nBits >= 2 );
    pGen[0] = CarryIn;
    pPro[0] = 0;
    pPro2[0]= 0;
    for ( b = 1; b <= nBits; b++ )
    {
        pGen[b] = Gia_ManHashAnd(pNew, pAdd0[b-1], pAdd1[b-1]);
        pPro[b] = Gia_ManHashXor(pNew, pAdd0[b-1], pAdd1[b-1]);
        pPro2[b]= pPro[b];
    }
    
    // Han-Carlson adder from http://www.aoki.ecei.tohoku.ac.jp/arith/mg/algorithm.html
    for ( b = 1; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-1]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-1]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    for ( i = 1; i < Log2-1; i++ )
    {
        for ( b = 1 + 2*i; b <= nBits; b += 2 )
        {
            Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-i*2]) );
            Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-i*2]);
            pPro[b] = Pro;
            pGen[b] = Gen;
        }
    }
    for ( b = nBits/2 + 1; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-nBits/2]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-nBits/2]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    for ( b = 2; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-1]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-1]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    
    for ( b = 0; b < nBits; b++ )
        pAdd0[b] = Gia_ManHashXor(pNew, pPro2[b+1], pGen[b]);
    pAdd0[nBits] = pGen[nBits];

    ABC_FREE(pGen);
    ABC_FREE(pPro);
    ABC_FREE(pPro2);
}